

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-common.h
# Opt level: O0

size_t aesgcm_decrypt(ptls_aead_context_t *_ctx,void *output,void *input,size_t inlen,uint64_t seq,
                     void *aad,size_t aadlen)

{
  int iVar1;
  size_t tag_offset;
  uint8_t iv [16];
  aesgcm_context_t *ctx;
  void *aad_local;
  uint64_t seq_local;
  size_t inlen_local;
  void *input_local;
  void *output_local;
  ptls_aead_context_t *_ctx_local;
  
  if (inlen < 0x10) {
    _ctx_local = (ptls_aead_context_t *)0xffffffffffffffff;
  }
  else {
    _ctx_local = (ptls_aead_context_t *)(inlen - 0x10);
    iv._8_8_ = _ctx;
    ptls_aead__build_iv(_ctx->algo,(uint8_t *)&tag_offset,(uint8_t *)&_ctx[6].do_encrypt_init,seq);
    iVar1 = cf_gcm_decrypt(&cf_aes,(void *)(iv._8_8_ + 0x50),(uint8_t *)input,(size_t)_ctx_local,
                           (uint8_t *)aad,aadlen,(uint8_t *)&tag_offset,0xc,
                           (uint8_t *)((long)input + (long)_ctx_local),0x10,(uint8_t *)output);
    if (iVar1 != 0) {
      _ctx_local = (ptls_aead_context_t *)0xffffffffffffffff;
    }
  }
  return (size_t)_ctx_local;
}

Assistant:

static inline size_t aesgcm_decrypt(ptls_aead_context_t *_ctx, void *output, const void *input, size_t inlen, uint64_t seq,
                                    const void *aad, size_t aadlen)
{
    struct aesgcm_context_t *ctx = (struct aesgcm_context_t *)_ctx;
    uint8_t iv[PTLS_AES_BLOCK_SIZE];

    if (inlen < PTLS_AESGCM_TAG_SIZE)
        return SIZE_MAX;
    size_t tag_offset = inlen - PTLS_AESGCM_TAG_SIZE;

    ptls_aead__build_iv(ctx->super.algo, iv, ctx->static_iv, seq);
    if (cf_gcm_decrypt(&cf_aes, &ctx->aes, input, tag_offset, aad, aadlen, iv, PTLS_AESGCM_IV_SIZE, (uint8_t *)input + tag_offset,
                       PTLS_AESGCM_TAG_SIZE, output) != 0)
        return SIZE_MAX;

    return tag_offset;
}